

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

int get_response(mg_connection *conn,char *ebuf,size_t ebuf_len,int *err)

{
  byte *pbVar1;
  byte bVar2;
  ushort uVar3;
  __int32_t *p_Var4;
  int iVar5;
  uint uVar6;
  mg_header *pmVar7;
  long lVar8;
  __int32_t **pp_Var9;
  longlong lVar10;
  long lVar11;
  byte *pbVar12;
  char *pcVar13;
  char *endptr;
  byte *local_58;
  mg_header *local_50;
  int local_44;
  int *local_40;
  char *local_38;
  
  conn->connection_type = 2;
  iVar5 = get_message(conn,ebuf,ebuf_len,err);
  if (iVar5 == 0) {
    return 0;
  }
  pbVar12 = (byte *)conn->buf;
  iVar5 = conn->buf_size;
  (conn->response_info).status_code = 0;
  (conn->response_info).num_headers = 0;
  (conn->response_info).status_text = (char *)0x0;
  (conn->response_info).http_version = (char *)0x0;
  local_40 = err;
  if (iVar5 < 1) {
    local_58 = pbVar12;
    if (iVar5 != 0) {
      bVar2 = *pbVar12;
      pmVar7 = (mg_header *)__ctype_b_loc();
      uVar3 = *(ushort *)((long)pmVar7->name + (ulong)bVar2 * 2);
      lVar11 = 0;
LAB_00113458:
      if ((uVar3 & 2) == 0) {
        local_50 = pmVar7;
        uVar6 = get_http_header_len((char *)pbVar12,iVar5);
        if (0 < (int)uVar6) {
          pbVar12[(ulong)uVar6 - 1] = 0;
          if ((((0xd < *pbVar12) || ((0x2401U >> (*pbVar12 & 0x1f) & 1) == 0)) &&
              (iVar5 = strncmp((char *)pbVar12,"HTTP/",5), iVar5 == 0)) &&
             (local_58 = pbVar12 + 5,
             (short)*(ushort *)((long)local_50->name + (ulong)pbVar12[5] * 2) < 0)) {
            (conn->response_info).http_version = (char *)local_58;
            iVar5 = skip_to_end_of_word_and_terminate((char **)&local_58,0);
            pbVar12 = local_58;
            if (((0 < iVar5) &&
                (iVar5 = skip_to_end_of_word_and_terminate((char **)&local_58,0), 0 < iVar5)) &&
               ((lVar8 = strtol((char *)pbVar12,&local_38,10), 0xfffffffffffffc7b < lVar8 - 1000U &&
                (((long)local_38 - (long)pbVar12 == 3 && (*local_38 == '\0')))))) {
              (conn->response_info).status_code = (int)lVar8;
              (conn->response_info).status_text = (char *)local_58;
              pbVar12 = local_58 + -1;
              do {
                bVar2 = pbVar12[1];
                pbVar12 = pbVar12 + 1;
              } while ((*(byte *)((long)local_50->name + (ulong)bVar2 * 2 + 1) & 0x40) != 0);
              if ((bVar2 == 0xd) || (bVar2 == 10)) {
                do {
                  *pbVar12 = 0;
                  pbVar1 = pbVar12 + 1;
                  pbVar12 = pbVar12 + 1;
                } while ((*(byte *)((long)local_50->name + (ulong)*pbVar1 * 2 + 1) & 0x20) != 0);
                local_50 = (conn->response_info).http_headers;
                local_58 = pbVar12;
                local_44 = parse_http_headers((char **)&local_58,local_50);
                (conn->response_info).num_headers = local_44;
                if ((-1 < local_44) &&
                   (iVar5 = uVar6 + (int)lVar11,
                   iVar5 != 0 && SCARRY4(uVar6,(int)lVar11) == iVar5 < 0)) {
                  pcVar13 = get_header(local_50,local_44,"Transfer-Encoding");
                  if (pcVar13 != (char *)0x0) {
                    pp_Var9 = __ctype_tolower_loc();
                    p_Var4 = *pp_Var9;
                    lVar11 = 0;
                    do {
                      pbVar1 = (byte *)(pcVar13 + lVar11);
                      pbVar12 = (byte *)("identity" + lVar11);
                      if (*pbVar1 == 0) break;
                      lVar11 = lVar11 + 1;
                    } while (p_Var4[*pbVar1] == p_Var4[*pbVar12]);
                    if (p_Var4[*pbVar1] != p_Var4[*pbVar12]) {
                      lVar11 = 0;
                      do {
                        pbVar1 = (byte *)(pcVar13 + lVar11);
                        pbVar12 = (byte *)("chunked" + lVar11);
                        if (*pbVar1 == 0) break;
                        lVar11 = lVar11 + 1;
                      } while (p_Var4[*pbVar1] == p_Var4[*pbVar12]);
                      if (p_Var4[*pbVar1] == p_Var4[*pbVar12]) {
                        conn->is_chunked = 1;
                        goto LAB_0011374d;
                      }
                      pcVar13 = "Bad request";
                      goto LAB_00113499;
                    }
                  }
                  pbVar12 = (byte *)get_header(local_50,local_44,"Content-Length");
                  if (pbVar12 == (byte *)0x0) {
                    iVar5 = (conn->response_info).status_code;
                    if (((99 < iVar5 - 100U) && (iVar5 != 0x130)) && (iVar5 != 0xcc)) {
                      conn->content_len = -1;
                      return 1;
                    }
                  }
                  else {
                    local_58 = (byte *)0x0;
                    lVar10 = strtoll((char *)pbVar12,(char **)&local_58,10);
                    conn->content_len = lVar10;
                    if (lVar10 < 0 || local_58 == pbVar12) {
                      mg_snprintf(conn,(int *)0x0,ebuf,ebuf_len,"%s","Bad request");
                      *local_40 = 0x19b;
                      return 0;
                    }
                    (conn->response_info).content_length = lVar10;
                    (conn->request_info).content_length = lVar10;
                    if ((conn->response_info).status_code != 0x130) {
                      return 1;
                    }
                  }
LAB_0011374d:
                  conn->content_len = 0;
                  return 1;
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    pmVar7 = (mg_header *)__ctype_b_loc();
    lVar11 = 0;
    do {
      uVar3 = *(ushort *)((long)pmVar7->name + (ulong)pbVar12[lVar11] * 2);
      if ((uVar3 >> 0xd & 1) == 0) {
        pbVar12 = pbVar12 + lVar11;
        iVar5 = iVar5 - (int)lVar11;
        local_58 = pbVar12;
        goto LAB_00113458;
      }
      lVar11 = lVar11 + 1;
    } while (iVar5 != (int)lVar11);
  }
  pcVar13 = "Bad response";
LAB_00113499:
  mg_snprintf(conn,(int *)0x0,ebuf,ebuf_len,"%s",pcVar13);
  *local_40 = 400;
  return 0;
}

Assistant:

static int
get_response(struct mg_connection *conn, char *ebuf, size_t ebuf_len, int *err)
{
	const char *cl;

	conn->connection_type =
	    CONNECTION_TYPE_RESPONSE; /* response (valid or not) */

	if (!get_message(conn, ebuf, ebuf_len, err)) {
		return 0;
	}

	if (parse_http_response(conn->buf, conn->buf_size, &conn->response_info)
	    <= 0) {
		mg_snprintf(conn,
		            NULL, /* No truncation check for ebuf */
		            ebuf,
		            ebuf_len,
		            "%s",
		            "Bad response");
		*err = 400;
		return 0;
	}

	/* Message is a valid response */

	if (((cl = get_header(conn->response_info.http_headers,
	                      conn->response_info.num_headers,
	                      "Transfer-Encoding"))
	     != NULL)
	    && mg_strcasecmp(cl, "identity")) {
		if (mg_strcasecmp(cl, "chunked")) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Bad request");
			*err = 400;
			return 0;
		}
		conn->is_chunked = 1;
		conn->content_len = 0; /* not yet read */
	} else if ((cl = get_header(conn->response_info.http_headers,
	                            conn->response_info.num_headers,
	                            "Content-Length"))
	           != NULL) {
		char *endptr = NULL;
		conn->content_len = strtoll(cl, &endptr, 10);
		if ((endptr == cl) || (conn->content_len < 0)) {
			mg_snprintf(conn,
			            NULL, /* No truncation check for ebuf */
			            ebuf,
			            ebuf_len,
			            "%s",
			            "Bad request");
			*err = 411;
			return 0;
		}
		/* Publish the content length back to the response info. */
		conn->response_info.content_length = conn->content_len;

		/* TODO: check if it is still used in response_info */
		conn->request_info.content_length = conn->content_len;

		/* TODO: we should also consider HEAD method */
		if (conn->response_info.status_code == 304) {
			conn->content_len = 0;
		}
	} else {
		/* TODO: we should also consider HEAD method */
		if (((conn->response_info.status_code >= 100)
		     && (conn->response_info.status_code <= 199))
		    || (conn->response_info.status_code == 204)
		    || (conn->response_info.status_code == 304)) {
			conn->content_len = 0;
		} else {
			conn->content_len = -1; /* unknown content length */
		}
	}

	return 1;
}